

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  U32 *pUVar2;
  int iVar3;
  char cVar4;
  undefined8 uVar5;
  ZSTD_matchState_t *pZVar6;
  U32 lowestValid_1;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  BYTE *pBVar12;
  byte bVar13;
  U32 UVar14;
  U32 UVar15;
  int *piVar16;
  BYTE *pBVar17;
  uint uVar18;
  BYTE *pBVar19;
  int *piVar20;
  long lVar21;
  uint uVar22;
  U32 UVar23;
  ulong uVar24;
  int *piVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  seqDef *psVar29;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_e8;
  uint local_dc;
  int *local_d8;
  U32 local_cc;
  U32 local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  seqStore_t *local_b8;
  BYTE *local_b0;
  ulong local_a8;
  uint local_9c;
  int *local_98;
  ulong local_90;
  BYTE *local_88;
  ZSTD_matchState_t *local_80;
  int *local_78;
  BYTE *local_70;
  int *local_68;
  int *local_60;
  BYTE *local_58;
  int *local_50;
  U32 *local_48;
  ulong local_40;
  ulong local_38;
  
  local_b0 = (ms->window).base;
  local_88 = (ms->window).dictBase;
  uVar22 = (ms->window).dictLimit;
  local_a8 = (ulong)uVar22;
  local_58 = (BYTE *)(ulong)(ms->window).lowLimit;
  local_c0 = (ms->cParams).windowLog;
  local_c4 = (ms->cParams).minMatch;
  if (5 < local_c4) {
    local_c4 = 6;
  }
  if (local_c4 < 5) {
    local_c4 = 4;
  }
  local_9c = (ms->cParams).searchLog;
  local_dc = 6;
  if (local_9c < 6) {
    local_dc = local_9c;
  }
  if (local_dc < 5) {
    local_dc = 4;
  }
  UVar23 = *rep;
  local_cc = rep[1];
  ms->lazySkipping = 0;
  local_70 = local_b0 + local_a8;
  local_bc = CONCAT31(local_bc._1_3_,local_70 == (BYTE *)src);
  local_98 = (int *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar24 = (ulong)uVar8;
  uVar18 = ((int)local_98 - (int)(local_b0 + uVar24)) + 1;
  uVar9 = 8;
  if (uVar18 < 8) {
    uVar9 = uVar18;
  }
  if (local_98 < local_b0 + uVar24) {
    uVar9 = 0;
  }
  bVar13 = (byte)local_dc;
  local_b8 = seqStore;
  local_80 = ms;
  local_48 = rep;
  if (uVar8 < uVar9 + uVar8) {
    local_c8 = local_cc;
    local_68 = (int *)src;
    if (0x20 < ms->rowHashLog + 8) {
LAB_001e75a7:
      local_cc = UVar23;
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar2 = ms->hashTable;
    pBVar17 = ms->tagTable;
    uVar11 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_c4 == 5) {
        uVar27 = *(long *)(local_b0 + uVar24) * -0x30e4432345000000;
LAB_001e67c3:
        uVar27 = (uVar27 ^ uVar11) >> (0x38U - cVar4 & 0x3f);
      }
      else {
        if (local_c4 == 6) {
          uVar27 = *(long *)(local_b0 + uVar24) * -0x30e4432340650000;
          goto LAB_001e67c3;
        }
        uVar27 = (ulong)((*(int *)(local_b0 + uVar24) * -0x61c8864f ^ (uint)uVar11) >>
                        (0x18U - cVar4 & 0x1f));
      }
      uVar18 = ((uint)(uVar27 >> 8) & 0xffffff) << (bVar13 & 0x1f);
      if (((ulong)(pUVar2 + uVar18) & 0x3f) != 0) {
LAB_001e74af:
        local_cc = UVar23;
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar17 + uVar18) & ~(-1L << (bVar13 & 0x3f))) != 0) {
LAB_001e74ce:
        local_cc = UVar23;
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar24 & 7] = (U32)uVar27;
      uVar24 = uVar24 + 1;
    } while (uVar9 + uVar8 != uVar24);
  }
  local_d8 = (int *)(srcSize + (long)src);
  piVar25 = (int *)((ulong)(local_70 == (BYTE *)src) + (long)src);
  if (piVar25 < local_98) {
    local_60 = (int *)(local_88 + local_a8);
    local_58 = local_58 + (long)local_88;
    local_bc = 1 << ((byte)local_c0 & 0x1f);
    local_c0 = uVar22 - 1;
    local_50 = local_d8 + -8;
    local_40 = ~(-1L << (bVar13 & 0x3f));
    do {
      piVar20 = local_d8;
      uVar22 = (int)piVar25 - (int)local_b0;
      iVar7 = uVar22 + 1;
      UVar15 = (ms->window).lowLimit;
      UVar14 = iVar7 - local_bc;
      if (iVar7 - UVar15 <= local_bc) {
        UVar14 = UVar15;
      }
      if (ms->loadedDictEnd != 0) {
        UVar14 = UVar15;
      }
      uVar8 = iVar7 - UVar23;
      pBVar17 = local_b0;
      if (uVar8 < (uint)local_a8) {
        pBVar17 = local_88;
      }
      local_c8 = local_cc;
      local_68 = (int *)src;
      if (local_c0 - uVar8 < 3) {
LAB_001e69a1:
        uVar24 = 0;
      }
      else {
        uVar24 = 0;
        if (UVar23 <= (uVar22 - UVar14) + 1) {
          if (*(int *)((long)piVar25 + 1) != *(int *)(pBVar17 + uVar8)) goto LAB_001e69a1;
          piVar16 = local_d8;
          if (uVar8 < (uint)local_a8) {
            piVar16 = local_60;
          }
          local_cc = UVar23;
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar25 + 5),(BYTE *)((long)(pBVar17 + uVar8) + 4),
                              (BYTE *)local_d8,(BYTE *)piVar16,local_70);
          uVar24 = sVar10 + 4;
          UVar23 = local_cc;
        }
      }
      local_cc = UVar23;
      local_e8 = 999999999;
      if (local_c4 == 6) {
        if (local_dc == 6) {
          uVar11 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
        }
        else if (local_dc == 5) {
          uVar11 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
        }
      }
      else if (local_c4 == 5) {
        if (local_dc == 6) {
          uVar11 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
        }
        else if (local_dc == 5) {
          uVar11 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
        }
      }
      else if (local_dc == 6) {
        uVar11 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
      }
      else if (local_dc == 5) {
        uVar11 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)piVar25,(BYTE *)piVar20,&local_e8);
      }
      uVar27 = uVar24;
      if (uVar24 < uVar11) {
        uVar27 = uVar11;
      }
      if (uVar27 < 4) {
        ms->lazySkipping = (uint)(0x8ff < (ulong)((long)piVar25 - (long)local_68));
        src = local_68;
        piVar25 = (int *)((long)piVar25 + ((ulong)((long)piVar25 - (long)local_68) >> 8) + 1);
        UVar23 = local_cc;
        local_cc = local_c8;
      }
      else {
        local_78 = piVar25;
        uVar28 = local_e8;
        if (uVar11 <= uVar24) {
          local_78 = (int *)((long)piVar25 + 1);
          uVar28 = 1;
        }
        local_90 = uVar27;
        if (piVar25 < local_98) {
          do {
            pZVar6 = local_80;
            uVar24 = (ulong)uVar22;
            piVar20 = (int *)((long)piVar25 + 1);
            uVar22 = uVar22 + 1;
            uVar8 = (uint)uVar28;
            if (uVar28 == 0) {
              uVar28 = 0;
            }
            else {
              UVar23 = (local_80->window).lowLimit;
              UVar15 = uVar22 - local_bc;
              if (uVar22 - UVar23 <= local_bc) {
                UVar15 = UVar23;
              }
              if (local_80->loadedDictEnd != 0) {
                UVar15 = UVar23;
              }
              uVar9 = uVar22 - local_cc;
              pBVar17 = local_b0;
              if (uVar9 < (uint)local_a8) {
                pBVar17 = local_88;
              }
              if (((2 < local_c0 - uVar9) && (local_cc <= uVar22 - UVar15)) &&
                 (*piVar20 == *(int *)(pBVar17 + uVar9))) {
                piVar16 = local_d8;
                if (uVar9 < (uint)local_a8) {
                  piVar16 = local_60;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar25 + 5),
                                    (BYTE *)((long)(pBVar17 + uVar9) + 4),(BYTE *)local_d8,
                                    (BYTE *)piVar16,local_70);
                if (uVar8 == 0) goto LAB_001e7490;
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar9 = 0x1f;
                  if (uVar8 != 0) {
                    for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                    }
                  }
                  if ((int)((uVar9 ^ 0x1f) + (int)local_90 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                    uVar28 = 1;
                    local_90 = sVar10 + 4;
                    local_78 = piVar20;
                  }
                }
              }
            }
            local_e8 = 999999999;
            local_38 = uVar24;
            if (local_c4 == 6) {
              if (local_dc == 6) {
                uVar24 = ZSTD_RowFindBestMatch_extDict_6_6
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
              else if (local_dc == 5) {
                uVar24 = ZSTD_RowFindBestMatch_extDict_6_5
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
              else {
                uVar24 = ZSTD_RowFindBestMatch_extDict_6_4
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
            }
            else if (local_c4 == 5) {
              if (local_dc == 6) {
                uVar24 = ZSTD_RowFindBestMatch_extDict_5_6
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
              else if (local_dc == 5) {
                uVar24 = ZSTD_RowFindBestMatch_extDict_5_5
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
              else {
                uVar24 = ZSTD_RowFindBestMatch_extDict_5_4
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
            }
            else if (local_dc == 6) {
              uVar24 = ZSTD_RowFindBestMatch_extDict_4_6
                                 (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
            }
            else if (local_dc == 5) {
              uVar24 = ZSTD_RowFindBestMatch_extDict_4_5
                                 (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
            }
            else {
              uVar24 = ZSTD_RowFindBestMatch_extDict_4_4
                                 (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
            }
            pZVar6 = local_80;
            uVar27 = local_90;
            uVar8 = (uint)local_e8;
            if ((uVar8 == 0) || (uVar9 = (uint)uVar28, uVar9 == 0)) goto LAB_001e7490;
            iVar7 = (int)local_90;
            if (uVar24 < 4) {
LAB_001e6cfb:
              if (local_98 <= piVar20) break;
              uVar22 = (int)local_38 + 2;
              UVar23 = (local_80->window).lowLimit;
              UVar15 = uVar22 - local_bc;
              if (uVar22 - UVar23 <= local_bc) {
                UVar15 = UVar23;
              }
              if (local_80->loadedDictEnd != 0) {
                UVar15 = UVar23;
              }
              uVar8 = uVar22 - local_cc;
              pBVar17 = local_b0;
              if (uVar8 < (uint)local_a8) {
                pBVar17 = local_88;
              }
              piVar20 = (int *)((long)piVar25 + 2);
              if (((2 < local_c0 - uVar8) && (local_cc <= uVar22 - UVar15)) &&
                 (*piVar20 == *(int *)(pBVar17 + uVar8))) {
                piVar16 = local_d8;
                if (uVar8 < (uint)local_a8) {
                  piVar16 = local_60;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar25 + 6),
                                    (BYTE *)((long)(pBVar17 + uVar8) + 4),(BYTE *)local_d8,
                                    (BYTE *)piVar16,local_70);
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar8 = 0x1f;
                  if (uVar9 != 0) {
                    for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                    }
                  }
                  if ((int)((uVar8 ^ 0x1f) + iVar7 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                    uVar28 = 1;
                    uVar27 = sVar10 + 4;
                    local_78 = piVar20;
                  }
                }
              }
              local_e8 = 999999999;
              if (local_c4 == 6) {
                if (local_dc == 6) {
                  uVar24 = ZSTD_RowFindBestMatch_extDict_6_6
                                     (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
                }
                else if (local_dc == 5) {
                  uVar24 = ZSTD_RowFindBestMatch_extDict_6_5
                                     (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
                }
                else {
                  uVar24 = ZSTD_RowFindBestMatch_extDict_6_4
                                     (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
                }
              }
              else if (local_c4 == 5) {
                if (local_dc == 6) {
                  uVar24 = ZSTD_RowFindBestMatch_extDict_5_6
                                     (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
                }
                else if (local_dc == 5) {
                  uVar24 = ZSTD_RowFindBestMatch_extDict_5_5
                                     (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
                }
                else {
                  uVar24 = ZSTD_RowFindBestMatch_extDict_5_4
                                     (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
                }
              }
              else if (local_dc == 6) {
                uVar24 = ZSTD_RowFindBestMatch_extDict_4_6
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
              else if (local_dc == 5) {
                uVar24 = ZSTD_RowFindBestMatch_extDict_4_5
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
              else {
                uVar24 = ZSTD_RowFindBestMatch_extDict_4_4
                                   (pZVar6,(BYTE *)piVar20,(BYTE *)local_d8,&local_e8);
              }
              uVar8 = (uint)local_e8;
              if ((uVar8 == 0) || (uVar9 = (uint)uVar28, uVar9 == 0)) {
LAB_001e7490:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                              ,0xab,"unsigned int ZSTD_highbit32(U32)");
              }
              if (uVar24 < 4) break;
              iVar7 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> iVar7 == 0; iVar7 = iVar7 + -1) {
                }
              }
              uVar8 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              if ((int)uVar24 * 4 - iVar7 <= (int)((uVar8 ^ 0x1f) + (int)uVar27 * 4 + -0x18)) break;
            }
            else {
              iVar3 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              uVar8 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              if ((int)uVar24 * 4 - iVar3 <= (int)((uVar8 ^ 0x1f) + iVar7 * 4 + -0x1b))
              goto LAB_001e6cfb;
            }
            piVar25 = piVar20;
            uVar27 = uVar24;
            uVar28 = local_e8;
            local_90 = uVar27;
            local_78 = piVar25;
          } while (piVar25 < local_98);
        }
        uVar22 = local_c4;
        piVar25 = local_78;
        UVar23 = local_cc;
        if (3 < uVar28) {
          pBVar19 = (BYTE *)((long)local_78 + (3 - (long)(local_b0 + uVar28)));
          pBVar12 = local_70;
          pBVar17 = local_b0;
          if ((uint)pBVar19 < (uint)local_a8) {
            pBVar12 = local_58;
            pBVar17 = local_88;
          }
          if ((local_68 < local_78) &&
             (uVar24 = (ulong)pBVar19 & 0xffffffff, pBVar12 < pBVar17 + uVar24)) {
            pBVar17 = pBVar17 + uVar24;
            do {
              piVar20 = (int *)((long)piVar25 + -1);
              pBVar17 = pBVar17 + -1;
              if ((*(BYTE *)piVar20 != *pBVar17) ||
                 (uVar27 = uVar27 + 1, piVar25 = piVar20, piVar20 <= local_68)) break;
            } while (pBVar12 < pBVar17);
          }
          UVar23 = (U32)uVar28 - 3;
          local_c8 = local_cc;
        }
        if (local_b8->maxNbSeq <=
            (ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart >> 3)) {
LAB_001e7569:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_b8->maxNbLit) {
LAB_001e754a:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar24 = (long)piVar25 - (long)local_68;
        pBVar17 = local_b8->lit;
        if (local_b8->litStart + local_b8->maxNbLit < pBVar17 + uVar24) {
LAB_001e74ed:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_d8 < piVar25) {
LAB_001e750c:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < piVar25) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_68,(BYTE *)piVar25,(BYTE *)local_50);
LAB_001e7022:
          local_b8->lit = local_b8->lit + uVar24;
          if (0xffff < uVar24) {
            if (local_b8->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_b8->longLengthType = ZSTD_llt_literalLength;
            local_b8->longLengthPos =
                 (U32)((ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)(local_68 + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)local_68;
          *(undefined8 *)(pBVar17 + 8) = uVar5;
          pBVar17 = local_b8->lit;
          if (0x10 < uVar24) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - (long)(local_68 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)(local_68 + 6);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(local_68 + 4);
            *(undefined8 *)(pBVar17 + 0x18) = uVar5;
            if (0x20 < (long)uVar24) {
              lVar21 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_68 + lVar21 + 0x20);
                uVar5 = puVar1[1];
                pBVar12 = pBVar17 + lVar21 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)local_68 + lVar21 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar5;
                lVar21 = lVar21 + 0x20;
              } while (pBVar12 + 0x20 < pBVar17 + uVar24);
            }
            goto LAB_001e7022;
          }
          local_b8->lit = pBVar17 + uVar24;
        }
        ms = local_80;
        psVar29 = local_b8->sequences;
        psVar29->litLength = (U16)uVar24;
        psVar29->offBase = (U32)uVar28;
        if (uVar27 < 3) {
LAB_001e752b:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar27 - 3) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
LAB_001e7588:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_matchLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)psVar29 - (long)local_b8->sequencesStart) >> 3);
        }
        psVar29->mlBase = (U16)(uVar27 - 3);
        psVar29 = psVar29 + 1;
        local_b8->sequences = psVar29;
        if (local_80->lazySkipping != 0) {
          uVar8 = local_80->nextToUpdate;
          uVar24 = (ulong)uVar8;
          uVar9 = ((int)local_98 - (int)(local_b0 + uVar24)) + 1;
          if (7 < uVar9) {
            uVar9 = 8;
          }
          if (local_98 < local_b0 + uVar24) {
            uVar9 = 0;
          }
          if (uVar8 < uVar9 + uVar8) {
            if (0x20 < local_80->rowHashLog + 8) goto LAB_001e75a7;
            pUVar2 = local_80->hashTable;
            pBVar17 = local_80->tagTable;
            uVar11 = local_80->hashSalt;
            cVar4 = (char)local_80->rowHashLog;
            do {
              if (uVar22 == 5) {
                uVar28 = *(long *)(local_b0 + uVar24) * -0x30e4432345000000;
LAB_001e71eb:
                uVar18 = (uint)((uVar28 ^ uVar11) >> (0x38U - cVar4 & 0x3f));
              }
              else {
                if (uVar22 == 6) {
                  uVar28 = *(long *)(local_b0 + uVar24) * -0x30e4432340650000;
                  goto LAB_001e71eb;
                }
                uVar18 = (*(int *)(local_b0 + uVar24) * -0x61c8864f ^ (uint)uVar11) >>
                         (0x18U - cVar4 & 0x1f);
              }
              uVar26 = (uVar18 >> 8) << ((byte)local_dc & 0x1f);
              if (((ulong)(pUVar2 + uVar26) & 0x3f) != 0) goto LAB_001e74af;
              if ((local_40 & (ulong)(pBVar17 + uVar26)) != 0) goto LAB_001e74ce;
              local_80->hashCache[(uint)uVar24 & 7] = uVar18;
              uVar24 = uVar24 + 1;
            } while (uVar9 + uVar8 != uVar24);
          }
          local_80->lazySkipping = 0;
        }
        src = (void *)((long)piVar25 + uVar27);
        piVar25 = (int *)src;
        local_cc = local_c8;
        if (src <= local_98) {
          do {
            uVar22 = local_cc;
            piVar20 = local_d8;
            iVar7 = (int)src - (int)local_b0;
            UVar15 = (ms->window).lowLimit;
            UVar14 = iVar7 - local_bc;
            if (iVar7 - UVar15 <= local_bc) {
              UVar14 = UVar15;
            }
            if (ms->loadedDictEnd != 0) {
              UVar14 = UVar15;
            }
            uVar8 = iVar7 - uVar22;
            pBVar17 = local_b0;
            if (uVar8 < (uint)local_a8) {
              pBVar17 = local_88;
            }
            piVar25 = (int *)src;
            local_cc = uVar22;
            if (((local_c0 - uVar8 < 3) || (iVar7 - UVar14 < uVar22)) ||
               (*src != *(int *)(pBVar17 + uVar8))) break;
            piVar25 = local_d8;
            if (uVar8 < (uint)local_a8) {
              piVar25 = local_60;
            }
            local_cc = UVar23;
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar8) + 4),
                                (BYTE *)local_d8,(BYTE *)piVar25,local_70);
            if (local_b8->maxNbSeq <= (ulong)((long)psVar29 - (long)local_b8->sequencesStart >> 3))
            goto LAB_001e7569;
            if (0x20000 < local_b8->maxNbLit) goto LAB_001e754a;
            pBVar17 = local_b8->lit;
            if (local_b8->litStart + local_b8->maxNbLit < pBVar17) goto LAB_001e74ed;
            if (piVar20 < src) goto LAB_001e750c;
            if (local_50 < src) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)src,(BYTE *)local_50);
            }
            else {
              uVar5 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar17 = *src;
              *(undefined8 *)(pBVar17 + 8) = uVar5;
            }
            psVar29 = local_b8->sequences;
            psVar29->litLength = 0;
            psVar29->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_001e752b;
            if (0xffff < sVar10 + 1) {
              if (local_b8->longLengthType != ZSTD_llt_none) goto LAB_001e7588;
              local_b8->longLengthType = ZSTD_llt_matchLength;
              local_b8->longLengthPos =
                   (U32)((ulong)((long)psVar29 - (long)local_b8->sequencesStart) >> 3);
            }
            psVar29->mlBase = (U16)(sVar10 + 1);
            psVar29 = psVar29 + 1;
            local_b8->sequences = psVar29;
            src = (void *)((long)src + sVar10 + 4);
            piVar25 = (int *)src;
            UVar23 = uVar22;
          } while (src <= local_98);
        }
      }
    } while (piVar25 < local_98);
  }
  *local_48 = UVar23;
  local_48[1] = local_cc;
  return (long)local_d8 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}